

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture3DLodControlTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture3DLodControlTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *this_01;
  FilterMode FVar1;
  TestLog *pTVar2;
  Texture3DLodControlTestInstance *pTVar3;
  int iVar4;
  float fVar5;
  deUint32 dVar6;
  uint uVar7;
  undefined4 extraout_var;
  TextureBinding *this_02;
  undefined4 extraout_var_00;
  byte bVar8;
  LodPrecision *__n;
  Surface *pSVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  float fVar10;
  int x;
  uint uVar11;
  int iVar12;
  undefined1 auVar13 [16];
  allocator<char> local_527;
  allocator<char> local_526;
  allocator<char> local_525;
  float local_524;
  ulong local_520;
  float local_514;
  ulong local_510;
  Texture3DLodControlTestInstance *local_508;
  deUint32 local_500;
  float local_4fc;
  uint local_4f8;
  int local_4f4;
  TestStatus *local_4f0;
  LodPrecision *local_4e8;
  int local_4dc;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  Texture3DView local_4a8;
  ConstPixelBufferAccess local_498;
  PixelBufferAccess local_470;
  PixelBufferAccess local_448;
  TextureFormat local_418;
  undefined8 uStack_410;
  Surface referenceFrame;
  Surface renderedFrame;
  PixelBufferAccess local_3d8;
  Surface errorMask;
  undefined1 local_398 [32];
  size_type sStack_378;
  BVec4 local_370;
  IVec4 formatBitDepth;
  undefined1 local_354 [76];
  size_type sStack_308;
  size_type local_300;
  int aiStack_2f8 [2];
  int local_2f0;
  anon_union_16_3_1194ccdc_for_v local_2ec [2];
  deUint32 local_2c8;
  deUint32 local_2c4;
  LogImage local_2c0;
  undefined1 local_230 [32];
  int local_210;
  anon_union_16_3_1194ccdc_for_v local_20c [22];
  TextureFormatInfo fmtInfo;
  Sampler sampler;
  TextureFormat *format;
  
  local_4f0 = __return_storage_ptr__;
  iVar4 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
  format = (TextureFormat *)CONCAT44(extraout_var,iVar4);
  tcu::getTextureFormatInfo(&fmtInfo,format);
  this_00 = &this->m_renderer;
  fVar5 = (float)util::TextureRenderer::getRenderWidth(this_00);
  dVar6 = util::TextureRenderer::getRenderHeight(this_00);
  util::createSampler(&sampler,CLAMP_TO_EDGE,CLAMP_TO_EDGE,this->m_minFilter,NEAREST);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_354,TEXTURETYPE_3D,&sampler,LODMODE_EXACT);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,(int)fVar5,dVar6);
  local_524 = (float)((int)fVar5 / 4);
  local_4f8 = (int)dVar6 / 4;
  util::createSampler((Sampler *)local_230,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_Texture3DTestCaseParameters.
                      super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                      minFilter,NEAREST);
  local_2f0 = local_210;
  local_300 = local_230._16_8_;
  aiStack_2f8[0] = local_230._24_4_;
  aiStack_2f8[1] = local_230._28_4_;
  local_354._68_8_ = local_230._0_8_;
  sStack_308 = local_230._8_8_;
  local_2ec[0]._0_8_ = local_20c[0]._0_8_;
  local_2ec[0]._8_8_ = local_20c[0]._8_8_;
  local_2ec[1]._0_8_ = local_20c[1]._0_8_;
  local_354._4_4_ = glu::TextureTestUtil::getSamplerType(*format);
  local_354._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_354._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_354._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_354._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_354._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_354._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_354._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_354._48_4_ = fmtInfo.lookupScale.m_data[3];
  uVar11 = this->m_texHeight;
  if (this->m_texHeight < this->m_texWidth) {
    uVar11 = this->m_texWidth;
  }
  if ((int)uVar11 <= this->m_texDepth) {
    uVar11 = this->m_texDepth;
  }
  if (uVar11 == 0) {
    uVar7 = 0x20;
  }
  else {
    uVar7 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  local_2c4 = 0x1f - uVar7;
  local_520 = 0;
  iVar4 = 0;
  local_508 = this;
  local_500 = dVar6;
  local_4fc = fVar5;
  while (fVar5 = local_4fc, dVar6 = local_500, iVar4 != 4) {
    local_510 = CONCAT44(local_510._4_4_,iVar4);
    uVar11 = local_500 - iVar4 * local_4f8;
    if (iVar4 != 3) {
      uVar11 = local_4f8;
    }
    local_514 = (float)(int)(iVar4 * local_4f8);
    local_4e8 = (LodPrecision *)CONCAT44(local_4e8._4_4_,(float)(int)uVar11);
    iVar12 = 0;
    for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
      fVar10 = local_524;
      if (iVar4 == 3) {
        fVar10 = fVar5;
      }
      uVar11 = (int)local_520 + iVar4;
      getBasicTexCoord3D(&texCoord,uVar11);
      (*(local_508->super_TestInstance)._vptr_TestInstance[3])(local_508,local_354,(ulong)uVar11);
      util::TextureRenderer::setViewport
                (this_00,(float)iVar12,local_514,(float)(int)fVar10,local_4e8._0_4_);
      this_02 = util::TextureRenderer::getTextureBinding(this_00,0);
      util::TextureBinding::updateTextureViewMipLevels(this_02,local_2c8,local_2c4);
      fVar5 = (float)((int)fVar5 - (int)local_524);
      iVar12 = iVar12 + (int)local_524;
      util::TextureRenderer::renderQuad
                (this_00,&renderedFrame,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_354);
    }
    local_520 = (ulong)((int)local_520 + 4);
    iVar4 = (int)local_510 + 1;
  }
  local_230._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_230);
  local_418.order = formatBitDepth.m_data[0];
  local_418.type = formatBitDepth.m_data[1];
  uStack_410._0_4_ = formatBitDepth.m_data[2];
  uStack_410._4_4_ = formatBitDepth.m_data[3];
  FVar1 = local_508->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,(int)fVar5,dVar6);
  tcu::Surface::Surface(&errorMask,(int)fVar5,dVar6);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_398);
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_398._0_4_ = 0x14;
  local_398._4_4_ = 0x14;
  local_398._8_4_ = 0x14;
  local_398._12_4_ = 0x10;
  local_398._16_4_ = 0x10;
  local_398._20_4_ = 0x10;
  local_448.super_ConstPixelBufferAccess.m_format = local_418;
  local_448.super_ConstPixelBufferAccess.m_size.m_data[0] = (int)uStack_410;
  local_448.super_ConstPixelBufferAccess.m_size.m_data[1] = uStack_410._4_4_;
  tcu::operator-((tcu *)&local_498,(Vector<int,_4> *)&local_448,
                 ((FVar1 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) == 0) + 1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_470,0);
  tcu::max<int,4>((tcu *)&local_2c0,(Vector<int,_4> *)&local_498,(Vector<int,_4> *)&local_470);
  tcu::computeFixedPointThreshold((tcu *)local_230,(IVec4 *)&local_2c0);
  local_398._24_8_ = local_230._0_8_;
  sStack_378 = local_230._8_8_;
  auVar13._0_4_ = -(uint)(0 < (int)local_418.order);
  auVar13._4_4_ = -(uint)(0 < (int)local_418.type);
  auVar13._8_4_ = -(uint)(0 < (int)uStack_410);
  auVar13._12_4_ = -(uint)(0 < uStack_410._4_4_);
  uVar11 = movmskps((int)&local_418,auVar13);
  bVar8 = (byte)uVar11;
  local_370.m_data =
       (bool  [4])
       (uVar11 & 1 | (uint)((bVar8 & 2) >> 1) << 8 | (uint)((bVar8 & 4) >> 2) << 0x10 |
       (uint)(bVar8 >> 3) << 0x18);
  __n = &lodPrec;
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 8;
  local_510 = 0;
  local_4f4 = 0;
  iVar4 = 0;
  while (iVar12 = local_4f4, pTVar3 = local_508, iVar4 != 4) {
    iVar12 = iVar4 * local_4f8;
    uVar11 = dVar6 - iVar12;
    if (iVar4 != 3) {
      uVar11 = local_4f8;
    }
    local_520 = (ulong)uVar11;
    x = 0;
    __n = (LodPrecision *)0x0;
    local_4dc = iVar4;
    while (iVar4 = (int)__n, iVar4 != 4) {
      fVar10 = local_524;
      if (iVar4 == 3) {
        fVar10 = fVar5;
      }
      uVar11 = (int)local_510 + iVar4;
      local_514 = fVar5;
      local_4e8 = __n;
      getBasicTexCoord3D(&texCoord,uVar11);
      (*(local_508->super_TestInstance)._vptr_TestInstance[3])(local_508,local_354,(ulong)uVar11);
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_230,&referenceFrame,(PixelFormat *)&local_418,x,iVar12,
                 (int)fVar10,(int)local_520);
      local_2c0.m_name._M_dataplus._M_p._0_4_ = format[9].order;
      local_2c0.m_name._M_string_length = *(size_type *)(format + 10);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_230,(Texture3DView *)&local_2c0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_354);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_2c0,&renderedFrame);
      tcu::getSubregion((PixelBufferAccess *)local_230,(PixelBufferAccess *)&local_2c0,x,iVar12,
                        (int)fVar10,(int)local_520);
      tcu::Surface::getAccess(&local_448,&referenceFrame);
      tcu::getSubregion((PixelBufferAccess *)&local_498,&local_448,x,iVar12,(int)fVar10,
                        (int)local_520);
      tcu::Surface::getAccess(&local_3d8,&errorMask);
      tcu::getSubregion(&local_470,&local_3d8,x,iVar12,(int)fVar10,(int)local_520);
      pTVar3 = local_508;
      iVar4 = (*(((local_508->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      local_4a8.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x48);
      local_4a8.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar4) + 0x50);
      iVar4 = glu::TextureTestUtil::computeTextureLookupDiff
                        ((ConstPixelBufferAccess *)local_230,&local_498,&local_470,&local_4a8,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_354,
                         (LookupPrecision *)local_398,&lodPrec,
                         ((pTVar3->super_TestInstance).m_context)->m_testCtx->m_watchDog);
      local_4f4 = local_4f4 + iVar4;
      fVar5 = (float)((int)local_514 - (int)local_524);
      x = x + (int)local_524;
      __n = (LodPrecision *)(ulong)((int)local_4e8 + 1);
    }
    local_510 = (ulong)((int)local_510 + 4);
    fVar5 = local_4fc;
    dVar6 = local_500;
    iVar4 = local_4dc + 1;
  }
  if (0 < local_4f4) {
    local_230._0_8_ = ((local_508->super_TestInstance).m_context)->m_testCtx->m_log;
    this_01 = (ostringstream *)(local_230 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,"ERROR: Image verification failed, found ");
    std::ostream::operator<<(this_01,iVar12);
    std::operator<<((ostream *)this_01," invalid pixels!");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
  }
  pTVar2 = ((pTVar3->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"Result",(allocator<char> *)&local_4a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"Verification result",&local_525);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_2c0,(string *)&local_498,(string *)&local_448)
  ;
  iVar4 = (int)pTVar2;
  tcu::LogImageSet::write((LogImageSet *)&local_2c0,iVar4,__buf,(size_t)__n);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"Rendered",&local_526);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"Rendered image",&local_527);
  pSVar9 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_230,(string *)&local_470,(string *)&local_3d8,pSVar9,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_230,iVar4,__buf_00,(size_t)pSVar9);
  tcu::LogImage::~LogImage((LogImage *)local_230);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_470);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_498);
  if (0 < iVar12) {
    pTVar2 = ((pTVar3->super_TestInstance).m_context)->m_testCtx->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_498,"Reference",(allocator<char> *)&local_4a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"Ideal reference",&local_525);
    pSVar9 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_230,(string *)&local_498,(string *)&local_448,pSVar9,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar4 = (int)pTVar2;
    tcu::LogImage::write((LogImage *)local_230,iVar4,__buf_01,(size_t)pSVar9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"ErrorMask",&local_526);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"Error mask",&local_527)
    ;
    pSVar9 = &errorMask;
    tcu::LogImage::LogImage
              (&local_2c0,(string *)&local_470,(string *)&local_3d8,pSVar9,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2c0,iVar4,__buf_02,(size_t)pSVar9);
    tcu::LogImage::~LogImage(&local_2c0);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_470);
    tcu::LogImage::~LogImage((LogImage *)local_230);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_498);
  }
  tcu::TestLog::endImageSet(((pTVar3->super_TestInstance).m_context)->m_testCtx->m_log);
  if (iVar12 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_230,"pass",(allocator<char> *)&local_2c0);
    tcu::TestStatus::pass(local_4f0,(string *)local_230);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_230,"fail",(allocator<char> *)&local_2c0);
    tcu::TestStatus::fail(local_4f0,(string *)local_230);
  }
  std::__cxx11::string::~string((string *)local_230);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  return local_4f0;
}

Assistant:

tcu::TestStatus Texture3DLodControlTestInstance::iterate (void)
{
	const tcu::Sampler::WrapMode	wrapS			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapT			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapR			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::FilterMode	magFilter		= Sampler::NEAREST;

	const tcu::Texture3D&			refTexture		= m_texture->getTexture();
	const tcu::TextureFormat&		texFmt			= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const int						viewportWidth	= m_renderer.getRenderWidth();
	const int						viewportHeight	= m_renderer.getRenderHeight();

	tcu::Sampler					sampler			= util::createSampler(wrapS, wrapT, m_minFilter, magFilter);
	ReferenceParams					refParams		(TEXTURETYPE_3D, sampler);
	vector<float>					texCoord;
	tcu::Surface					renderedFrame	(viewportWidth, viewportHeight);

	// Viewport is divided into 4x4 grid.
	const int						gridWidth		= 4;
	const int						gridHeight		= 4;
	const int						cellWidth		= viewportWidth / gridWidth;
	const int						cellHeight		= viewportHeight / gridHeight;

	// Sampling parameters.
	refParams.sampler		= util::createSampler(wrapS, wrapT, wrapR, m_testParameters.minFilter, magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;
	refParams.maxLevel		= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth));

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int	curX		= cellWidth*gridX;
			const int	curY		= cellHeight*gridY;
			const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
			const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
			const int	cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord3D(texCoord, cellNdx);

			getReferenceParams(refParams,cellNdx);
			//Render
			m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
			m_renderer.getTextureBinding(0)->updateTextureViewMipLevels(refParams.baseLevel, refParams.maxLevel);
			m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
		}
	}

	// Compare and log
	{
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const bool				isTrilinear		= m_minFilter == Sampler::NEAREST_MIPMAP_LINEAR || m_minFilter == Sampler::LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewportWidth, viewportHeight);
		tcu::Surface			errorMask		(viewportWidth, viewportHeight);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_VULKAN);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int	curX		= cellWidth*gridX;
				const int	curY		= cellHeight*gridY;
				const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
				const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
				const int	cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord3D(texCoord, cellNdx);
				getReferenceParams(refParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], refParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getTexture(), &texCoord[0], refParams,
															lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
			}
		}

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;
		}

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}